

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O0

float __thiscall
Opcode::AABBTreeOfTrianglesBuilder::GetSplittingValue
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box,
          udword axis)

{
  MeshInterface *pMVar1;
  int *piVar2;
  uint local_8c;
  udword i;
  VertexPointers VP;
  float SplitValue;
  udword axis_local;
  AABB *global_box_local;
  udword nb_prims_local;
  udword *primitives_local;
  AABBTreeOfTrianglesBuilder *this_local;
  IndexedTriangle *T;
  
  if (((this->super_AABBTreeBuilder).mSettings.mRules & 0x20) == 0) {
    this_local._4_4_ =
         AABBTreeBuilder::GetSplittingValue
                   (&this->super_AABBTreeBuilder,primitives,nb_prims,global_box,axis);
  }
  else {
    VP.Vertex[2]._0_4_ = 0.0;
    for (local_8c = 0; local_8c < nb_prims; local_8c = local_8c + 1) {
      pMVar1 = this->mIMesh;
      piVar2 = (int *)((long)pMVar1->mTris->mVRef +
                      (ulong)(primitives[local_8c] * pMVar1->mTriStride));
      VP.Vertex[2]._0_4_ =
           *(float *)((long)&pMVar1->mVerts->x +
                     (ulong)axis * 4 + (ulong)(piVar2[2] * pMVar1->mVertexStride)) +
           *(float *)((long)&pMVar1->mVerts->x +
                     (ulong)axis * 4 + (ulong)(piVar2[1] * pMVar1->mVertexStride)) +
           *(float *)((long)&pMVar1->mVerts->x +
                     (ulong)axis * 4 + (ulong)(*piVar2 * pMVar1->mVertexStride)) +
           VP.Vertex[2]._0_4_;
    }
    this_local._4_4_ = VP.Vertex[2]._0_4_ / (float)(nb_prims * 3);
  }
  return this_local._4_4_;
}

Assistant:

float AABBTreeOfTrianglesBuilder::GetSplittingValue(const udword* primitives, udword nb_prims, const AABB& global_box, udword axis)	const
{
	if(mSettings.mRules&SPLIT_GEOM_CENTER)
	{
		// Loop through triangles
		float SplitValue = 0.0f;
		VertexPointers VP;
		for(udword i=0;i<nb_prims;i++)
		{
			// Get current triangle-vertices
			mIMesh->GetTriangle(VP, primitives[i]);
			// Update split value
			SplitValue += (*VP.Vertex[0])[axis];
			SplitValue += (*VP.Vertex[1])[axis];
			SplitValue += (*VP.Vertex[2])[axis];
		}
		return SplitValue / float(nb_prims*3);
	}
	else return AABBTreeBuilder::GetSplittingValue(primitives, nb_prims, global_box, axis);
}